

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

int Cut_CellTruthLookup(uint *pTruth,int nVars)

{
  uint *pInOut;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  Cut_CMan_t *pCVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  int iVar31;
  int iVar32;
  undefined1 auVar29 [16];
  int iVar33;
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar42 [16];
  Cut_Cell_t *pTemp;
  Cut_Cell_t Cell;
  long *local_c8;
  Cut_Cell_t local_c0;
  
  pCVar22 = s_pCMan;
  if (s_pCMan == (Cut_CMan_t *)0x0) {
    puts("Cut_CellTruthLookup: Cell manager is not defined.");
  }
  else {
    memset(&local_c0,0,0x98);
    local_c0._32_4_ = nVars & 0xf;
    pInOut = local_c0.uTruth;
    uVar23 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar23 = 1;
    }
    if (0 < (int)uVar23) {
      memcpy(pInOut,pTruth,(ulong)uVar23 << 2);
    }
    Cut_CellSuppMin(&local_c0);
    uVar23 = local_c0._32_4_ & 0xf;
    if (uVar23 != 0) {
      lVar25 = (ulong)uVar23 - 1;
      auVar29._8_4_ = (int)lVar25;
      auVar29._0_8_ = lVar25;
      auVar29._12_4_ = (int)((ulong)lVar25 >> 0x20);
      auVar29 = auVar29 ^ _DAT_008403e0;
      iVar24 = auVar29._0_4_;
      iVar31 = auVar29._4_4_;
      iVar32 = auVar29._8_4_;
      iVar33 = auVar29._12_4_;
      auVar34._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar34._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar34._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar34._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar42._4_4_ = -(uint)(iVar24 < -0x80000000);
      auVar42._0_4_ = -(uint)(iVar24 < -0x80000000);
      auVar42._8_4_ = -(uint)(iVar32 < -0x7fffffff);
      auVar42._12_4_ = -(uint)(iVar32 < -0x7fffffff);
      auVar34 = auVar34 & auVar42;
      auVar42 = pshuflw(in_XMM4,auVar34,0xe8);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar35,auVar42 ^ auVar35);
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_c0.CanonPerm[0] = '\0';
      }
      auVar35 = packssdw(auVar34,auVar34);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar1,auVar35 ^ auVar1);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._0_4_ >> 8 & 1) != 0) {
        local_c0.CanonPerm[1] = '\x01';
      }
      auVar36._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar36._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar36._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar36._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar2._4_4_ = -(uint)(iVar24 < -0x7ffffffe);
      auVar2._0_4_ = -(uint)(iVar24 < -0x7ffffffe);
      auVar2._8_4_ = -(uint)(iVar32 < -0x7ffffffd);
      auVar2._12_4_ = -(uint)(iVar32 < -0x7ffffffd);
      auVar36 = auVar36 & auVar2;
      auVar42 = packssdw(auVar42,auVar36);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar3,auVar42 ^ auVar3);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
        local_c0.CanonPerm[2] = '\x02';
      }
      auVar35 = pshufhw(auVar36,auVar36,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar4,auVar35 ^ auVar4);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._0_4_ >> 0x18 & 1) != 0) {
        local_c0.CanonPerm[3] = '\x03';
      }
      auVar37._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar37._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar37._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar37._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar5._4_4_ = -(uint)(iVar24 < -0x7ffffffc);
      auVar5._0_4_ = -(uint)(iVar24 < -0x7ffffffc);
      auVar5._8_4_ = -(uint)(iVar32 < -0x7ffffffb);
      auVar5._12_4_ = -(uint)(iVar32 < -0x7ffffffb);
      auVar37 = auVar37 & auVar5;
      auVar42 = pshuflw(auVar42,auVar37,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar6,auVar42 ^ auVar6);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_c0.CanonPerm[4] = '\x04';
      }
      auVar35 = packssdw(auVar37,auVar37);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar7,auVar35 ^ auVar7);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._4_2_ >> 8 & 1) != 0) {
        local_c0.CanonPerm[5] = '\x05';
      }
      auVar38._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar38._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar38._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar38._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar8._4_4_ = -(uint)(iVar24 < -0x7ffffffa);
      auVar8._0_4_ = -(uint)(iVar24 < -0x7ffffffa);
      auVar8._8_4_ = -(uint)(iVar32 < -0x7ffffff9);
      auVar8._12_4_ = -(uint)(iVar32 < -0x7ffffff9);
      auVar38 = auVar38 & auVar8;
      auVar42 = packssdw(auVar42,auVar38);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar9,auVar42 ^ auVar9);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_c0.CanonPerm[6] = '\x06';
      }
      auVar35 = pshufhw(auVar38,auVar38,0x84);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar10,auVar35 ^ auVar10);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._6_2_ >> 8 & 1) != 0) {
        local_c0.CanonPerm[7] = '\a';
      }
      auVar39._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar39._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar39._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar39._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar11._4_4_ = -(uint)(iVar24 < -0x7ffffff8);
      auVar11._0_4_ = -(uint)(iVar24 < -0x7ffffff8);
      auVar11._8_4_ = -(uint)(iVar32 < -0x7ffffff7);
      auVar11._12_4_ = -(uint)(iVar32 < -0x7ffffff7);
      auVar39 = auVar39 & auVar11;
      auVar42 = pshuflw(auVar42,auVar39,0xe8);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar12,auVar42 ^ auVar12);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_c0.CanonPerm[8] = '\b';
      }
      auVar35 = packssdw(auVar39,auVar39);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar13,auVar35 ^ auVar13);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._8_2_ >> 8 & 1) != 0) {
        local_c0.CanonPerm[9] = '\t';
      }
      auVar40._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar40._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar40._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar40._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar14._4_4_ = -(uint)(iVar24 < -0x7ffffff6);
      auVar14._0_4_ = -(uint)(iVar24 < -0x7ffffff6);
      auVar14._8_4_ = -(uint)(iVar32 < -0x7ffffff5);
      auVar14._12_4_ = -(uint)(iVar32 < -0x7ffffff5);
      auVar40 = auVar40 & auVar14;
      auVar42 = packssdw(auVar42,auVar40);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar15,auVar42 ^ auVar15);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_c0.CanonPerm[10] = '\n';
      }
      auVar35 = pshufhw(auVar40,auVar40,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar16,auVar35 ^ auVar16);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._10_2_ >> 8 & 1) != 0) {
        local_c0.CanonPerm[0xb] = '\v';
      }
      auVar41._0_4_ = -(uint)(iVar31 == -0x80000000);
      auVar41._4_4_ = -(uint)(iVar31 == -0x80000000);
      auVar41._8_4_ = -(uint)(iVar33 == -0x80000000);
      auVar41._12_4_ = -(uint)(iVar33 == -0x80000000);
      auVar17._4_4_ = -(uint)(iVar24 < -0x7ffffff4);
      auVar17._0_4_ = -(uint)(iVar24 < -0x7ffffff4);
      auVar17._8_4_ = -(uint)(iVar32 < -0x7ffffff3);
      auVar17._12_4_ = -(uint)(iVar32 < -0x7ffffff3);
      auVar41 = auVar41 & auVar17;
      auVar42 = pshuflw(auVar42,auVar41,0xe8);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar18,auVar42 ^ auVar18);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_c0.Store[0]._0_1_ = 0xc;
      }
      auVar42 = packssdw(auVar41,auVar41);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar19,auVar42 ^ auVar19);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._12_2_ >> 8 & 1) != 0) {
        local_c0.Store[0]._1_1_ = 0xd;
      }
      auVar28._0_4_ = -(uint)(DAT_008d2620._4_4_ == iVar31);
      auVar28._4_4_ = -(uint)(DAT_008d2620._4_4_ == iVar31);
      auVar28._8_4_ = -(uint)(DAT_008d2620._12_4_ == iVar33);
      auVar28._12_4_ = -(uint)(DAT_008d2620._12_4_ == iVar33);
      auVar20._4_4_ = -(uint)(iVar24 < (int)DAT_008d2620);
      auVar20._0_4_ = -(uint)(iVar24 < (int)DAT_008d2620);
      auVar20._8_4_ = -(uint)(iVar32 < DAT_008d2620._8_4_);
      auVar20._12_4_ = -(uint)(iVar32 < DAT_008d2620._8_4_);
      auVar28 = auVar28 & auVar20;
      auVar42 = packssdw(_DAT_008d2620,auVar28);
      auVar30._8_4_ = 0xffffffff;
      auVar30._0_8_ = 0xffffffffffffffff;
      auVar30._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar30,auVar42 ^ auVar30);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_c0.Store[1]._0_1_ = 0xe;
      }
      auVar42 = pshufhw(auVar28,auVar28,0x84);
      auVar42 = packssdw(auVar42 ^ auVar30,auVar42 ^ auVar30);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._14_2_ >> 8 & 1) != 0) {
        local_c0.Store[1]._1_1_ = 0xf;
      }
    }
    uVar23 = Extra_TruthSemiCanonicize
                       (pInOut,pCVar22->puAux,uVar23,local_c0.CanonPerm,local_c0.Store);
    iVar24 = 1 << ((char)(local_c0._32_4_ & 0xf) - 5U & 0x1f);
    if ((local_c0._32_4_ & 0xf) < 6) {
      iVar24 = 1;
    }
    local_c0._32_4_ = local_c0._32_4_ & 0x3fff | uVar23 << 0xe;
    uVar23 = Extra_TruthHash(pInOut,iVar24);
    iVar24 = st__lookup(pCVar22->tTable,(char *)(ulong)uVar23,(char **)&local_c8);
    if (local_c8 != (long *)0x0 && iVar24 != 0) {
      local_c0._32_4_ = local_c0._32_4_ & 0xf;
      uVar27 = (ulong)(uint)(1 << ((char)local_c0._32_4_ - 5U & 0x1f));
      if ((uint)local_c0._32_4_ < 6) {
        uVar27 = 1;
      }
      do {
        uVar26 = uVar27;
        if ((*(uint *)(local_c8 + 4) & 0xf) == local_c0._32_4_) {
          do {
            if ((long)uVar26 < 1) {
              *(int *)(local_c8 + 3) = (int)local_c8[3] + 1;
              pCVar22->nCellFound = pCVar22->nCellFound + 1;
              return 1;
            }
            lVar25 = uVar26 * 4;
            lVar21 = uVar26 - 1;
            uVar26 = uVar26 - 1;
          } while (*(uint *)((long)local_c8 + lVar25 + 0x50) == local_c0.uTruth[lVar21]);
        }
        local_c8 = (long *)*local_c8;
      } while (local_c8 != (long *)0x0);
    }
    pCVar22->nCellNotFound = pCVar22->nCellNotFound + 1;
  }
  return 0;
}

Assistant:

int Cut_CellTruthLookup( unsigned * pTruth, int nVars )
{
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    Cut_Cell_t Cell, * pCell = &Cell;
    unsigned Hash;
    int i;

    // cell manager is not defined
    if ( p == NULL )
    {
        printf( "Cut_CellTruthLookup: Cell manager is not defined.\n" );
        return 0;
    }

    // canonicize
    memset( pCell, 0, sizeof(Cut_Cell_t) );
    pCell->nVars = nVars;
    Extra_TruthCopy( pCell->uTruth, pTruth, nVars );
    Cut_CellSuppMin( pCell );
    // set the elementary permutation
    for ( i = 0; i < (int)pCell->nVars; i++ )
        pCell->CanonPerm[i] = i;
    // canonicize
    pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );


    // check if the cell exists
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum(pCell->nVars) );
    if ( st__lookup( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char **)&pTemp ) )
    {
        for ( ; pTemp; pTemp = pTemp->pNext )
        {
            if ( pTemp->nVars != pCell->nVars )
                continue;
            if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            {
                pTemp->nUsed++;
                p->nCellFound++;
                return 1;
            }
        }
    }
    p->nCellNotFound++;
    return 0;
}